

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixCurrentTime(sqlite3_vfs *NotUsed,double *prNow)

{
  int iVar1;
  double dVar2;
  timeval sNow;
  timeval local_20;
  
  iVar1 = gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    dVar2 = (double)(local_20.tv_usec / 1000 + local_20.tv_sec * 1000 + 0xbfc83e532200);
  }
  else {
    dVar2 = 0.0;
  }
  *prNow = dVar2 / 86400000.0;
  return (uint)(iVar1 != 0);
}

Assistant:

static int unixCurrentTime(sqlite3_vfs *NotUsed, double *prNow){
  sqlite3_int64 i = 0;
  int rc;
  UNUSED_PARAMETER(NotUsed);
  rc = unixCurrentTimeInt64(0, &i);
  *prNow = i/86400000.0;
  return rc;
}